

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O0

void rw::conv_RGBA5551_from_ARGB1555(uint8 *out,uint8 *in)

{
  byte bVar1;
  uint uVar2;
  uint32 a;
  uint32 b;
  uint32 g;
  uint32 r;
  uint8 *in_local;
  uint8 *out_local;
  
  bVar1 = in[1];
  uVar2 = (in[1] & 3) << 3 | (int)(uint)*in >> 5;
  *out = (byte)((int)(uint)in[1] >> 7) | (*in & 0x1f) << 1 | (byte)(uVar2 << 6);
  out[1] = (byte)(uVar2 >> 2) | (byte)(((int)(uint)bVar1 >> 2 & 0x1fU) << 3);
  return;
}

Assistant:

void
conv_RGBA5551_from_ARGB1555(uint8 *out, uint8 *in)
{
	uint32 r, g, b, a;
	a = (in[1]>>7) & 1;
	r = (in[1]>>2) & 0x1F;
	g = (in[1]&3)<<3 | ((in[0]>>5)&7);
	b = in[0] & 0x1F;
	out[0] = a | b<<1 | g<<6;
	out[1] = g>>2 | r<<3;
}